

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binomial.h
# Opt level: O3

void __thiscall CBinomialHeap::InsertList(CBinomialHeap *this,CBinomialNode **otherRoot)

{
  int iVar1;
  CBinomialNode *pCVar2;
  CBinomialNode *pCVar3;
  CBinomialNode *pCVar4;
  CBinomialNode *pCVar5;
  CBinomialNode **ppCVar6;
  bool bVar7;
  
  pCVar3 = *otherRoot;
  bVar7 = pCVar3 != (CBinomialNode *)0x0;
  if (this->root_ == (CBinomialNode *)0x0 || !bVar7) {
    pCVar4 = (CBinomialNode *)0x0;
  }
  else {
    pCVar5 = (CBinomialNode *)0x0;
    pCVar2 = this->root_;
    do {
      pCVar4 = pCVar2;
      iVar1 = pCVar4->degree_;
      pCVar2 = pCVar3;
      while (pCVar3 = pCVar2, pCVar3->degree_ < iVar1) {
        ppCVar6 = &pCVar5->next_;
        if (pCVar5 == (CBinomialNode *)0x0) {
          ppCVar6 = &this->root_;
        }
        *ppCVar6 = pCVar3;
        pCVar2 = pCVar3->next_;
        pCVar3->next_ = pCVar4;
        pCVar5 = pCVar3;
        if (pCVar2 == (CBinomialNode *)0x0) {
          return;
        }
      }
      pCVar5 = pCVar4;
      pCVar2 = pCVar4->next_;
    } while (pCVar4->next_ != (CBinomialNode *)0x0);
    bVar7 = true;
  }
  if (bVar7) {
    pCVar4->next_ = pCVar3;
  }
  return;
}

Assistant:

void InsertList(CBinomialNode*& otherRoot) {

        CBinomialNode *lefter = nullptr, *iter1 = root_, *iter2 = otherRoot, *temp;

        while (iter1 && iter2) {
            if (iter1->degree_ <= iter2->degree_) {
                lefter = iter1;
                iter1 = iter1->next_;
                continue;
            }
            if (lefter)
                lefter->next_ = iter2;
            else
                root_ = iter2;
            temp = iter2->next_;
            iter2->next_ = iter1;
            lefter = iter2;
            iter2 = temp;
        }

        if (iter2) {
            lefter->next_ = iter2;
        }
    }